

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_pack_s32_u16(c_v64 a,c_v64 b)

{
  c_v64 cVar1;
  undefined2 local_38;
  undefined2 local_34;
  undefined2 local_30;
  undefined2 local_2c;
  undefined2 local_28;
  undefined2 local_24;
  undefined2 local_20;
  undefined2 local_1c;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local.u32[1] = a.u32[1];
  if (a_local.s32[1] < 0x10000) {
    if ((long)a < 0) {
      local_20 = 0;
    }
    else {
      local_20 = a.u16[2];
    }
    local_1c = local_20;
  }
  else {
    local_1c = 0xffff;
  }
  a_local.u32[0] = a.u32[0];
  if (a_local.s32[0] < 0x10000) {
    if ((int)a_local._0_4_ < 0) {
      local_28 = 0;
    }
    else {
      local_28 = a.u16[0];
    }
    local_24 = local_28;
  }
  else {
    local_24 = 0xffff;
  }
  b_local.u32[1] = b.u32[1];
  if (b_local.s32[1] < 0x10000) {
    if ((long)b < 0) {
      local_30 = 0;
    }
    else {
      local_30 = b.u16[2];
    }
    local_2c = local_30;
  }
  else {
    local_2c = 0xffff;
  }
  b_local.u32[0] = b.u32[0];
  if (b_local.s32[0] < 0x10000) {
    if ((int)b_local._0_4_ < 0) {
      local_38 = 0;
    }
    else {
      local_38 = b.u16[0];
    }
    local_34 = local_38;
  }
  else {
    local_34 = 0xffff;
  }
  cVar1.u16[1] = local_2c;
  cVar1.u16[0] = local_34;
  cVar1.u16[2] = local_24;
  cVar1.u16[3] = local_1c;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_pack_s32_u16(c_v64 a, c_v64 b) {
  c_v64 t;
  if (CONFIG_BIG_ENDIAN) {
    c_v64 u = a;
    a = b;
    b = u;
  }
  t.u16[3] = SIMD_CLAMP(a.s32[1], 0, 65535);
  t.u16[2] = SIMD_CLAMP(a.s32[0], 0, 65535);
  t.u16[1] = SIMD_CLAMP(b.s32[1], 0, 65535);
  t.u16[0] = SIMD_CLAMP(b.s32[0], 0, 65535);
  return t;
}